

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcmpfld_s.c
# Opt level: O2

errno_t strcmpfld_s(char *dest,rsize_t dmax,char *src,int *indicator)

{
  long lVar1;
  rsize_t rVar2;
  errno_t error;
  errno_t eVar3;
  char *msg;
  char cVar4;
  char cVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (indicator == (int *)0x0) {
    msg = "strcmpfld_s: indicator is null";
LAB_001049c1:
    eVar3 = 400;
    error = 400;
  }
  else {
    *indicator = 0;
    if (dest == (char *)0x0) {
      msg = "strcmpfld_s: dest is null";
      goto LAB_001049c1;
    }
    if (src == (char *)0x0) {
      msg = "strcmpfld_s: src is null";
      goto LAB_001049c1;
    }
    if (dmax == 0) {
      msg = "strcmpfld_s: dmax is 0";
      eVar3 = 0x191;
      error = 0x191;
    }
    else {
      if (dmax < 0x10000001) {
        for (rVar2 = 0; dmax != rVar2; rVar2 = rVar2 + 1) {
          cVar4 = dest[rVar2];
          cVar5 = src[rVar2];
          if (cVar4 != cVar5) goto LAB_00104a20;
        }
        cVar4 = dest[dmax];
        cVar5 = src[dmax];
LAB_00104a20:
        *indicator = (int)cVar4 - (int)cVar5;
        eVar3 = 0;
        goto LAB_001049d2;
      }
      msg = "strcmpfld_s: dmax exceeds max";
      eVar3 = 0x193;
      error = 0x193;
    }
  }
  invoke_safe_str_constraint_handler(msg,(void *)0x0,error);
LAB_001049d2:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return eVar3;
  }
  __stack_chk_fail();
}

Assistant:

errno_t
strcmpfld_s (const char *dest, rsize_t dmax,
             const char *src, int *indicator)
{
    if (indicator == NULL) {
        invoke_safe_str_constraint_handler("strcmpfld_s: indicator is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }
    *indicator = 0;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strcmpfld_s: dest is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (src == NULL) {
        invoke_safe_str_constraint_handler("strcmpfld_s: src is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strcmpfld_s: dmax is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strcmpfld_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }

    /* compare for dmax charactrers, not the null! */
    while (dmax) {

        if (*dest != *src) {
            break;
        }

        dest++;
        src++;
        dmax--;
    }

    *indicator = *dest - *src;
    return (EOK);
}